

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void blend_a64_mask_sy_w8_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [16];
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  undefined1 auVar20 [16];
  undefined1 auVar28 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  auVar12 = _DAT_004689b0;
  do {
    uVar1 = *(undefined8 *)mask;
    uVar2 = *(undefined8 *)(mask + mask_stride);
    auVar28[0] = pavgb((char)uVar2,(char)uVar1);
    cVar13 = pavgb((char)((ulong)uVar2 >> 8),(char)((ulong)uVar1 >> 8));
    cVar14 = pavgb((char)((ulong)uVar2 >> 0x10),(char)((ulong)uVar1 >> 0x10));
    cVar15 = pavgb((char)((ulong)uVar2 >> 0x18),(char)((ulong)uVar1 >> 0x18));
    cVar16 = pavgb((char)((ulong)uVar2 >> 0x20),(char)((ulong)uVar1 >> 0x20));
    cVar17 = pavgb((char)((ulong)uVar2 >> 0x28),(char)((ulong)uVar1 >> 0x28));
    cVar18 = pavgb((char)((ulong)uVar2 >> 0x30),(char)((ulong)uVar1 >> 0x30));
    cVar19 = pavgb((char)((ulong)uVar2 >> 0x38),(char)((ulong)uVar1 >> 0x38));
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    uVar3 = *(ulong *)src0;
    uVar1 = *(undefined8 *)src1;
    auVar27._8_6_ = 0;
    auVar27._0_8_ = uVar3;
    auVar27[0xe] = (char)(uVar3 >> 0x38);
    auVar27[0xf] = (char)((ulong)uVar1 >> 0x38);
    auVar26._14_2_ = auVar27._14_2_;
    auVar26._8_5_ = 0;
    auVar26._0_8_ = uVar3;
    auVar26[0xd] = (char)((ulong)uVar1 >> 0x30);
    auVar25._13_3_ = auVar26._13_3_;
    auVar25._8_4_ = 0;
    auVar25._0_8_ = uVar3;
    auVar25[0xc] = (char)(uVar3 >> 0x30);
    auVar24._12_4_ = auVar25._12_4_;
    auVar24._8_3_ = 0;
    auVar24._0_8_ = uVar3;
    auVar24[0xb] = (char)((ulong)uVar1 >> 0x28);
    auVar23._11_5_ = auVar24._11_5_;
    auVar23._8_2_ = 0;
    auVar23._0_8_ = uVar3;
    auVar23[10] = (char)(uVar3 >> 0x28);
    auVar22._10_6_ = auVar23._10_6_;
    auVar22[8] = 0;
    auVar22._0_8_ = uVar3;
    auVar22[9] = (char)((ulong)uVar1 >> 0x20);
    auVar21._9_7_ = auVar22._9_7_;
    auVar21[8] = (char)(uVar3 >> 0x20);
    auVar21._0_8_ = uVar3;
    auVar20._8_8_ = auVar21._8_8_;
    auVar20[7] = (char)((ulong)uVar1 >> 0x18);
    auVar20[6] = (char)(uVar3 >> 0x18);
    auVar20[5] = (char)((ulong)uVar1 >> 0x10);
    auVar20[4] = (char)(uVar3 >> 0x10);
    auVar20[3] = (char)((ulong)uVar1 >> 8);
    auVar20[2] = (char)(uVar3 >> 8);
    auVar20[0] = (undefined1)uVar3;
    auVar20[1] = (char)uVar1;
    auVar28._8_8_ =
         (undefined8)
         (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11('@' - cVar19,cVar19),
                                                                '@' - cVar18),cVar18),'@' - cVar17),
                                     cVar17),'@' - cVar16),CONCAT11(cVar16,cVar19)) >> 8);
    auVar28[7] = '@' - cVar15;
    auVar28[6] = cVar15;
    auVar28[5] = '@' - cVar14;
    auVar28[4] = cVar14;
    auVar28[3] = '@' - cVar13;
    auVar28[2] = cVar13;
    auVar28[1] = '@' - auVar28[0];
    auVar28 = pmaddubsw(auVar20,auVar28);
    auVar28 = pmulhrsw(auVar28,auVar12);
    sVar4 = auVar28._0_2_;
    sVar5 = auVar28._2_2_;
    sVar6 = auVar28._4_2_;
    sVar7 = auVar28._6_2_;
    sVar8 = auVar28._8_2_;
    sVar9 = auVar28._10_2_;
    sVar10 = auVar28._12_2_;
    sVar11 = auVar28._14_2_;
    *(ulong *)dst =
         CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar28[0xe] - (0xff < sVar11),
                  CONCAT16((0 < sVar10) * (sVar10 < 0x100) * auVar28[0xc] - (0xff < sVar10),
                           CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar28[10] - (0xff < sVar9),
                                    CONCAT14((0 < sVar8) * (sVar8 < 0x100) * auVar28[8] -
                                             (0xff < sVar8),
                                             CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar28[6] -
                                                      (0xff < sVar7),
                                                      CONCAT12((0 < sVar6) * (sVar6 < 0x100) *
                                                               auVar28[4] - (0xff < sVar6),
                                                               CONCAT11((0 < sVar5) *
                                                                        (sVar5 < 0x100) * auVar28[2]
                                                                        - (0xff < sVar5),
                                                                        (0 < sVar4) *
                                                                        (sVar4 < 0x100) * auVar28[0]
                                                                        - (0xff < sVar4))))))));
    dst = dst + dst_stride;
    src0 = (uint8_t *)((long)src0 + (ulong)src0_stride);
    src1 = src1 + src1_stride;
    mask = mask + mask_stride * 2;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_sy_w8_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  (void)w;

  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  do {
    const __m128i v_ra_b = xx_loadl_64(mask);
    const __m128i v_rb_b = xx_loadl_64(mask + mask_stride);
    const __m128i v_m0_b = _mm_avg_epu8(v_ra_b, v_rb_b);
    const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);
    const __m128i v_res_b = blend_8_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);

    xx_storel_64(dst, v_res_b);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}